

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

int redisNetRead(redisContext *c,char *buf,size_t bufcap)

{
  ssize_t sVar1;
  int *piVar2;
  int nread;
  size_t bufcap_local;
  char *buf_local;
  redisContext *c_local;
  
  sVar1 = recv(c->fd,buf,bufcap,0);
  c_local._4_4_ = (int)sVar1;
  if (c_local._4_4_ == -1) {
    piVar2 = __errno_location();
    if (((*piVar2 == 0xb) && ((c->flags & 1U) == 0)) || (piVar2 = __errno_location(), *piVar2 == 4))
    {
      c_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      if ((*piVar2 == 0x6e) && ((c->flags & 1U) != 0)) {
        __redisSetError(c,6,"recv timeout");
        c_local._4_4_ = -1;
      }
      else {
        __redisSetError(c,1,(char *)0x0);
        c_local._4_4_ = -1;
      }
    }
  }
  else if (c_local._4_4_ == 0) {
    __redisSetError(c,3,"Server closed the connection");
    c_local._4_4_ = -1;
  }
  return c_local._4_4_;
}

Assistant:

int redisNetRead(redisContext *c, char *buf, size_t bufcap) {
    int nread = recv(c->fd, buf, bufcap, 0);
    if (nread == -1) {
        if ((errno == EWOULDBLOCK && !(c->flags & REDIS_BLOCK)) || (errno == EINTR)) {
            /* Try again later */
            return 0;
        } else if(errno == ETIMEDOUT && (c->flags & REDIS_BLOCK)) {
            /* especially in windows */
            __redisSetError(c, REDIS_ERR_TIMEOUT, "recv timeout");
            return -1;
        } else {
            __redisSetError(c, REDIS_ERR_IO, NULL);
            return -1;
        }
    } else if (nread == 0) {
        __redisSetError(c, REDIS_ERR_EOF, "Server closed the connection");
        return -1;
    } else {
        return nread;
    }
}